

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Implicit_manifold_intersection_oracle.h
# Opt level: O1

VectorXd __thiscall
Gudhi::coxeter_triangulation::
Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
::
compute_boundary_lambda<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,Gudhi::coxeter_triangulation::Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>
          (Implicit_manifold_intersection_oracle<Gudhi::coxeter_triangulation::Function_Sm_in_Rd,Gudhi::coxeter_triangulation::Function_Sm_in_Rd>
           *this,Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                 *simplex,
          Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          *triangulation)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  pointer piVar4;
  const_iterator cVar5;
  undefined8 *puVar6;
  Vertex_handle *in_RCX;
  DenseStorage<double,__1,__1,__1,_0> *rows;
  double *pdVar7;
  char *__function;
  DenseStorage<double,__1,__1,__1,_0> *pDVar8;
  long lVar9;
  Index extraout_RDX;
  pointer piVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  VectorXd VVar14;
  ActualDstType actualDst;
  MatrixXd matrix;
  VectorXd z;
  VectorXd bv_coords;
  VectorXd v_coords;
  vector<int,_std::allocator<int>_> v;
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  __end0;
  DenseStorage<double,__1,__1,__1,_0> local_1d8;
  Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_1b8;
  pointer local_180;
  ulong local_178;
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *local_170;
  long local_168;
  Vertex_handle *local_160;
  double *local_158;
  double *local_150;
  undefined1 local_148 [24];
  vector<int,_std::allocator<int>_> local_130;
  SrcXprType local_118;
  vector<int,_std::allocator<int>_> local_108;
  byte local_f0;
  double *local_e0;
  undefined1 local_d0 [48];
  const_iterator local_a0;
  const_iterator cStack_98;
  vector<int,_std::allocator<int>_> local_90;
  bool local_78;
  undefined7 uStack_77;
  double *local_68;
  
  local_180 = (simplex->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  rows = (DenseStorage<double,__1,__1,__1,_0> *)((long)local_180 + 2);
  local_1d8.m_data = (double *)0x0;
  local_1d8.m_rows = 0;
  local_1d8.m_cols = 0;
  local_170 = simplex;
  if ((long)rows < 0) {
    __function = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
    ;
  }
  else {
    if ((rows != (DenseStorage<double,__1,__1,__1,_0> *)0x0) &&
       (auVar2._8_8_ = 0, auVar2._0_8_ = rows,
       auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar3 / auVar2,0) < (long)rows)) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(8,simplex,SUB168(auVar3 % auVar2,0));
      *puVar6 = operator_delete;
      __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_160 = in_RCX;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              (&local_1d8,(long)rows * (long)rows,(Index)rows,(Index)rows);
    if (rows != (DenseStorage<double,__1,__1,__1,_0> *)0x0) {
      if (local_1d8.m_rows < 1) {
LAB_00128e57:
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                     );
      }
      pDVar8 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
      pdVar7 = local_1d8.m_data;
      do {
        if (local_1d8.m_cols <= (long)pDVar8) goto LAB_00128e57;
        *pdVar7 = 1.0;
        pDVar8 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar8->m_data + 1);
        pdVar7 = pdVar7 + local_1d8.m_rows;
      } while (rows != pDVar8);
    }
    Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::vertex_range((Vertex_range *)local_d0,
                   (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    *)triangulation);
    local_1b8.o_it_._M_current =
         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0._0_8_;
    local_1b8.o_end_._M_current =
         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0._8_8_;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_1b8.value_,(vector<int,_std::allocator<int>_> *)(local_d0 + 0x10));
    local_1b8.is_end_ = local_d0[0x28];
    local_118.m_dec =
         (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_a0._M_current;
    local_118.m_rhs = (Matrix<double,__1,_1,_0,__1,_1> *)cStack_98._M_current;
    std::vector<int,_std::allocator<int>_>::vector(&local_108,&local_90);
    piVar4 = local_180;
    local_f0 = local_78;
    if ((local_1b8.is_end_ & local_78) == 0) {
      local_178 = (long)local_180 + 1;
      local_148._16_8_ = local_170 + 1;
      local_168 = 0;
      lVar12 = 0;
      do {
        std::vector<int,_std::allocator<int>_>::vector(&local_130,&local_1b8.value_);
        Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::cartesian_coordinates
                  ((Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    *)&local_158,local_160,1.0);
        Function_Sm_in_Rd::operator()((Function_Sm_in_Rd *)local_148,(VectorXd *)local_170);
        free(local_158);
        if (1 < local_178) {
          piVar10 = (pointer)0x1;
          do {
            if ((long)local_148._8_8_ < (long)piVar10) goto LAB_00128e76;
            if ((local_1d8.m_rows <= (long)piVar10) || (local_1d8.m_cols <= lVar12))
            goto LAB_00128e57;
            *(undefined8 *)
             ((long)local_1d8.m_data + (long)piVar10 * 8 + local_1d8.m_rows * local_168) =
                 *(undefined8 *)(local_148._0_8_ + (long)piVar10 * 8 + -8);
            bVar13 = piVar10 != piVar4;
            piVar10 = (pointer)((long)piVar10 + 1);
          } while (bVar13);
        }
        Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
        ::cartesian_coordinates
                  ((Freudenthal_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    *)&local_e0,local_160,1.0);
        Function_Sm_in_Rd::operator()((Function_Sm_in_Rd *)&local_158,(VectorXd *)local_148._16_8_);
        free(local_e0);
        if ((long)local_150 < 1) goto LAB_00128e76;
        if ((((long)local_178 < 0) || (local_1d8.m_rows <= (long)local_178)) ||
           (local_1d8.m_cols <= lVar12)) goto LAB_00128e57;
        local_1d8.m_data[(long)local_180 + local_1d8.m_rows * lVar12 + 1] = *local_158;
        free(local_158);
        free((void *)local_148._0_8_);
        if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_1b8.is_end_ == false) {
          Vertex_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
          ::update_value(&local_1b8);
          local_1b8.o_it_._M_current = local_1b8.o_it_._M_current + 1;
          if (local_1b8.o_it_._M_current == local_1b8.o_end_._M_current) {
            local_1b8.is_end_ = true;
          }
        }
        lVar12 = lVar12 + 1;
        local_168 = local_168 + 8;
      } while ((local_1b8.is_end_ != true) || ((local_f0 & 1) == 0));
    }
    if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1b8.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b8.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1b8.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1b8.value_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((double *)local_d0._16_8_ != (double *)0x0) {
      operator_delete((void *)local_d0._16_8_,local_d0._32_8_ - local_d0._16_8_);
    }
    local_1b8.o_it_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    local_1b8.o_end_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    cVar5._M_current = local_1b8.o_it_._M_current;
    if (rows != (DenseStorage<double,__1,__1,__1,_0> *)0x0) {
      free((void *)0x0);
      if (rows == (DenseStorage<double,__1,__1,__1,_0> *)0x0) {
        local_1b8.o_it_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
        cVar5._M_current = local_1b8.o_it_._M_current;
      }
      else {
        if ((ulong)rows >> 0x3d != 0) {
LAB_00128f18:
          puVar6 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar6 = operator_delete;
          __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        cVar5._M_current =
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)malloc((long)rows * 8);
        if (rows != (DenseStorage<double,__1,__1,__1,_0> *)0x1 &&
            ((ulong)cVar5._M_current & 0xf) != 0) {
          __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                        "void *Eigen::internal::aligned_malloc(std::size_t)");
        }
        if ((DenseStorage<double,__1,__1,__1,_0> *)cVar5._M_current ==
            (DenseStorage<double,__1,__1,__1,_0> *)0x0) goto LAB_00128f18;
      }
    }
    local_1b8.o_it_._M_current = cVar5._M_current;
    local_1b8.o_end_._M_current = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)rows;
    if (rows == (DenseStorage<double,__1,__1,__1,_0> *)0x0) {
LAB_00128e76:
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
    ((local_1b8.o_it_._M_current)->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
    if (rows != (DenseStorage<double,__1,__1,__1,_0> *)0x1) {
      memset(&((local_1b8.o_it_._M_current)->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish,0,(long)local_180 * 8 + 8);
    }
    Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_d0,
               (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_1d8);
    Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
    _check_solve_assertion<false,Eigen::MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)
               local_d0,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_1b8);
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    local_118.m_dec = (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_d0;
    local_118.m_rhs = (Matrix<double,__1,_1,_0,__1,_1> *)&local_1b8;
    if (-1 < (long)local_d0._16_8_) {
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                ((DenseStorage<double,__1,__1,_1,_0> *)this,local_d0._16_8_,local_d0._16_8_,1);
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run((Matrix<double,__1,_1,_0,__1,_1> *)this,&local_118,
            (assign_op<double,_double> *)&local_130);
      free(local_68);
      free((void *)CONCAT71(uStack_77,local_78));
      free(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish);
      free(cStack_98._M_current);
      free((void *)CONCAT71(local_d0._41_7_,local_d0[0x28]));
      free((void *)local_d0._24_8_);
      free((void *)local_d0._0_8_);
      if (local_1d8.m_cols != *(long *)(this + 8)) {
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                      "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                     );
      }
      local_118.m_dec =
           (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x3d719799812dea11;
      local_d0._0_8_ = &local_1d8;
      local_d0._8_8_ = this;
      bVar13 = Eigen::internal::
               isApprox_selector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_false>
               ::run((Matrix<double,__1,_1,_0,__1,_1> *)&local_1b8,
                     (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                      *)local_d0,(RealScalar *)&local_118);
      if ((!bVar13) && (lVar12 = *(long *)(this + 8), lVar12 != 0)) {
        lVar1 = *(long *)this;
        lVar9 = 0;
        lVar11 = 0;
        if (0 < lVar12) {
          lVar11 = lVar12;
        }
        do {
          if (lVar11 == lVar9) goto LAB_00128e76;
          *(undefined8 *)(lVar1 + lVar9 * 8) = 0x7ff8000000000000;
          lVar9 = lVar9 + 1;
        } while (lVar12 != lVar9);
      }
      free(local_1b8.o_it_._M_current);
      free(local_1d8.m_data);
      VVar14.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           extraout_RDX;
      VVar14.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)this;
      return (VectorXd)
             VVar14.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
    }
    __function = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
    ;
  }
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,__function);
}

Assistant:

Eigen::VectorXd compute_boundary_lambda(const Simplex_handle& simplex, const Triangulation& triangulation) const {
    std::size_t cod_d = this->cod_d();
    Eigen::MatrixXd matrix(cod_d + 2, cod_d + 2);
    for (std::size_t i = 0; i < cod_d + 2; ++i) matrix(0, i) = 1;
    std::size_t j = 0;
    for (auto v : simplex.vertex_range()) {
      Eigen::VectorXd v_coords = fun_(triangulation.cartesian_coordinates(v));
      for (std::size_t i = 1; i < cod_d + 1; ++i) matrix(i, j) = v_coords(i - 1);
      Eigen::VectorXd bv_coords = domain_fun_(triangulation.cartesian_coordinates(v));
      matrix(cod_d + 1, j) = bv_coords(0);
      j++;
    }
    Eigen::VectorXd z(cod_d + 2);
    z(0) = 1;
    for (std::size_t i = 1; i < cod_d + 2; ++i) z(i) = 0;
    Eigen::VectorXd lambda = matrix.colPivHouseholderQr().solve(z);
    if (!z.isApprox(matrix*lambda)) {
      // NaN non valid results
      for (std::size_t i = 0; i < (std::size_t)lambda.size(); ++i) lambda(i) =
        std::numeric_limits<double>::quiet_NaN();
    }
    return lambda;
  }